

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.h
# Opt level: O0

void __thiscall crnlib::etc1_optimizer::params::clear_optimizer_params(params *this)

{
  params *this_local;
  
  this->m_num_src_pixels = 0;
  this->m_pSrc_pixels = (color_quad_u8 *)0x0;
  this->m_use_color4 = false;
  this->m_pScan_deltas = clear_optimizer_params::s_default_scan_delta;
  this->m_scan_delta_size = 1;
  color_quad<unsigned_char,_int>::clear(&this->m_base_color5);
  this->m_constrain_against_base_color5 = false;
  return;
}

Assistant:

void clear_optimizer_params()
            {
                m_num_src_pixels = 0;
                m_pSrc_pixels = 0;

                m_use_color4 = false;
                static const int s_default_scan_delta[] = { 0 };
                m_pScan_deltas = s_default_scan_delta;
                m_scan_delta_size = 1;

                m_base_color5.clear();
                m_constrain_against_base_color5 = false;
            }